

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool flatbuffers::ReadEnvironmentVariable(char *var_name,string *_value)

{
  char *__s;
  allocator<char> local_49;
  string local_48 [32];
  char *local_28;
  char *env_str;
  string *_value_local;
  char *var_name_local;
  
  env_str = (char *)_value;
  _value_local = (string *)var_name;
  __s = getenv(var_name);
  if (__s == (char *)0x0) {
    var_name_local._7_1_ = false;
  }
  else {
    if (env_str != (char *)0x0) {
      local_28 = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
      std::__cxx11::string::operator=((string *)env_str,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    var_name_local._7_1_ = true;
  }
  return var_name_local._7_1_;
}

Assistant:

bool ReadEnvironmentVariable(const char *var_name, std::string *_value) {
#ifdef _MSC_VER
  __pragma(warning(disable : 4996));  // _CRT_SECURE_NO_WARNINGS
#endif
  auto env_str = std::getenv(var_name);
  if (!env_str) return false;
  if (_value) *_value = std::string(env_str);
  return true;
}